

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O1

void __thiscall helics::Federate::finalizeAsync(Federate *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Result_base *p_Var4;
  InvalidFunctionCall *this_00;
  _State_baseV2 *__tmp;
  bool bVar5;
  string_view message;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  handle asyncInfo;
  __state_type local_88;
  long *local_70;
  __basic_future<void> local_68;
  _func_int **local_58 [2];
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *local_48;
  unique_lock<std::mutex> local_40;
  
  if (this->singleThreadFederate == true) {
    this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    message._M_str = "Async function calls and methods are not allowed for single thread federates";
    message._M_len = 0x4c;
    InvalidFunctionCall::InvalidFunctionCall(this_00,message);
    __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
  }
  switch((this->currentMode)._M_i) {
  case FINALIZE:
  case ERROR_STATE:
  case PENDING_FINALIZE:
    goto switchD_002424b7_caseD_3;
  case PENDING_INIT:
    enterInitializingModeComplete(this);
    break;
  case PENDING_EXEC:
    enterExecutingModeComplete(this);
    break;
  case PENDING_TIME:
    requestTimeComplete(this);
    break;
  case PENDING_ITERATIVE_TIME:
    requestTimeIterativeComplete(this);
  }
  local_48 = (this->asyncCallInfo)._M_t.
             super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
             .
             super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
             ._M_head_impl;
  local_40._M_device = &local_48->m_mutex;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  LOCK();
  (this->currentMode)._M_i = PENDING_FINALIZE;
  UNLOCK();
  local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00560558;
  peVar1 = (element_type *)(p_Var3 + 1);
  p_Var3[2]._M_use_count = 0;
  p_Var3[1]._M_use_count = 0;
  p_Var3[1]._M_weak_count = 0;
  *(undefined8 *)((long)&p_Var3[1]._M_weak_count + 1) = 0;
  p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[3]._M_use_count = 0;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_005605a8;
  p_Var4 = (_Result_base *)operator_new(0x10);
  *(undefined8 *)p_Var4 = 0;
  *(undefined8 *)(p_Var4 + 8) = 0;
  std::__future_base::_Result_base::_Result_base(p_Var4);
  *(undefined ***)p_Var4 = &PTR__M_destroy_00561140;
  p_Var3[4]._vptr__Sp_counted_base = (_func_int **)p_Var4;
  *(Federate **)&p_Var3[4]._M_use_count = this;
  local_58[0] = (_func_int **)0x0;
  local_70 = (long *)operator_new(0x20);
  *local_70 = (long)&PTR___State_00560600;
  local_70[1] = (long)peVar1;
  local_70[2] = (long)std::__future_base::
                      _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:839:25)>_>,_void>
                      ::_M_run;
  local_70[3] = 0;
  std::thread::_M_start_thread(local_58,&local_70,0);
  if (local_70 != (long *)0x0) {
    (**(code **)(*local_70 + 8))();
  }
  _Var2._M_pi = local_88.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (p_Var3[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
    std::terminate();
  }
  p_Var3[3]._vptr__Sp_counted_base = local_58[0];
  bVar5 = local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar1;
  local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3;
  if (bVar5) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var2._M_pi);
  }
  if (local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
    p_Var3->_M_use_count = 1;
    p_Var3->_M_weak_count = 1;
    p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00560640;
    p_Var3[2]._M_use_count = 0;
    p_Var3[1]._M_use_count = 0;
    p_Var3[1]._M_weak_count = 0;
    *(undefined8 *)((long)&p_Var3[1]._M_weak_count + 1) = 0;
    p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00560690;
    p_Var4 = (_Result_base *)operator_new(0x10);
    *(undefined8 *)p_Var4 = 0;
    *(undefined8 *)(p_Var4 + 8) = 0;
    std::__future_base::_Result_base::_Result_base(p_Var4);
    _Var2._M_pi = local_88.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    *(undefined ***)p_Var4 = &PTR__M_destroy_00561140;
    p_Var3[3]._vptr__Sp_counted_base = (_func_int **)p_Var4;
    *(Federate **)&p_Var3[3]._M_use_count = this;
    bVar5 = local_88.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(p_Var3 + 1);
    local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3;
    if (bVar5) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var2._M_pi);
    }
  }
  std::__basic_future<void>::__basic_future(&local_68,&local_88);
  if (local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_88.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  _Var2._M_pi = local_68._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  peVar1 = local_68._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_68._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (local_48->m_obj).finalizeFuture.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (local_48->m_obj).finalizeFuture.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (local_48->m_obj).finalizeFuture.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if (local_68._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
switchD_002424b7_caseD_3:
  return;
}

Assistant:

void Federate::finalizeAsync()
{
    if (singleThreadFederate) {
        throw(InvalidFunctionCall(
            "Async function calls and methods are not allowed for single thread federates"));
    }
    switch (currentMode) {
        case Modes::PENDING_INIT:
            enterInitializingModeComplete();
            break;
        case Modes::PENDING_EXEC:
            enterExecutingModeComplete();
            break;
        case Modes::PENDING_TIME:
            requestTimeComplete();
            break;
        case Modes::PENDING_ITERATIVE_TIME:
            requestTimeIterativeComplete();
            break;
        case Modes::FINALIZE:
        case Modes::ERROR_STATE:
        case Modes::PENDING_FINALIZE:
            return;
            // do nothing
        default:
            break;
    }
    auto finalizeFunc = [this]() { return coreObject->finalize(fedID); };
    auto asyncInfo = asyncCallInfo->lock();
    updateFederateMode(Modes::PENDING_FINALIZE);
    asyncInfo->finalizeFuture = std::async(std::launch::async, finalizeFunc);
}